

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

void __thiscall
TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_Test::testBody
          (TEST_MockComparatorCopierTest_installCopiersWorksHierarchically_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40;
  SimpleString local_30;
  MyTypeForTesting object;
  MyTypeForTestingCopier copier;
  
  MyTypeForTesting::MyTypeForTesting(&object,1);
  copier.super_MockNamedValueCopier._vptr_MockNamedValueCopier =
       (MockNamedValueCopier)&PTR__MockNamedValueCopier_002bc998;
  SimpleString::SimpleString(&local_60,"existing");
  mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_50,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_50,&copier);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"existing");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_50,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_50);
  SimpleString::SimpleString(&local_30,"MyTypeForTesting");
  SimpleString::SimpleString(&local_40,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
            ((long *)CONCAT44(extraout_var,iVar1),&local_30,&local_40,&object);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"existing");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_50,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_50);
  SimpleString::SimpleString(&local_30,"MyTypeForTesting");
  SimpleString::SimpleString(&local_40,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x30))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_30,&local_40,&object);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])(pMVar2);
  SimpleString::~SimpleString(&local_60);
  MyTypeForTesting::~MyTypeForTesting(&object);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, installCopiersWorksHierarchically)
{
    MyTypeForTesting object(1);
    MyTypeForTestingCopier copier;

    mock("existing");
    mock().installCopier("MyTypeForTesting", copier);
    mock("existing").expectOneCall("function").withOutputParameterOfTypeReturning("MyTypeForTesting", "parameterName", &object);
    mock("existing").actualCall("function").withOutputParameterOfType("MyTypeForTesting", "parameterName", &object);

    mock().checkExpectations();
    mock().removeAllComparatorsAndCopiers();
}